

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O1

int __thiscall ReadData::ReadRefPos(ReadData *this,BUFF *socketdata,uchar *HeadBuff)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uchar *Message;
  ReadData *pRVar5;
  int aiStack_48 [2];
  ReadData *pRStack_40;
  uchar *local_38;
  
  iVar3 = 6;
  if ((this->Head).MessageID == 0x2f) {
    iVar3 = (this->Head).MessageLength;
    iVar1 = (int)((long)iVar3 + 4U);
    iVar4 = -1;
    if (-5 < iVar3) {
      iVar4 = iVar1;
    }
    pRStack_40 = (ReadData *)0x109965;
    local_38 = HeadBuff;
    Message = (uchar *)operator_new__((long)iVar4);
    iVar4 = socketdata->pos;
    if (socketdata->len - iVar4 < iVar3) {
      socketdata->pos = iVar4 + -0x1c;
      iVar3 = 2;
    }
    else {
      pRStack_40 = (ReadData *)0x1099a1;
      memcpy(Message,socketdata->buff + iVar4,(long)iVar3 + 4U);
      socketdata->pos = iVar4 + iVar1;
      pRStack_40 = (ReadData *)0x1099be;
      bVar2 = CRCCheck(local_38,Message,iVar3,iVar3);
      if (bVar2) {
        pRStack_40 = (ReadData *)U2L;
        pRVar5 = this;
        ReadRefPos();
        pRStack_40 = this;
        memcpy(aiStack_48,Message,(long)(int)pRVar5);
        return aiStack_48[0];
      }
      pRStack_40 = (ReadData *)0x1099ca;
      operator_delete__(Message);
      iVar3 = 3;
    }
  }
  return iVar3;
}

Assistant:

int ReadData::ReadRefPos(BUFF &socketdata, unsigned char* HeadBuff) {
    if(Head.MessageID != 47)
        return CONFLICT_ID;
    
    char* buff = new char [Head.MessageLength + 4];
    if(socketdata.len - socketdata.pos < Head.MessageLength) {
        socketdata.pos -= 28;
        return FILE_OR_BUFF_END;
    }
    memcpy(buff, socketdata.buff + socketdata.pos, Head.MessageLength + 4);
    socketdata.pos += Head.MessageLength + 4;
    if(!CRCCheck(HeadBuff, (unsigned char*)buff, Head.MessageLength, Head.MessageLength)) {
        delete[] buff;
        return CRC_FAILED;
    }

    try {
        UserPsrPos.B = C2D(buff + 8, 8);
        UserPsrPos.L = C2D(buff + 16, 8);
        UserPsrPos.H = C2D(buff + 24, 8);
    } 
    catch(...) {
        cout << "error happened when reading GPS ehpe" << endl;
        return UNKNOWN_ERROR;
    }
    
    delete [] buff;  
}